

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall kratos::Expr::Expr(Expr *this,Var *left,Var *right)

{
  uint32_t var_width;
  int iVar1;
  undefined4 extraout_var;
  uint32_t *puVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  bool *pbVar4;
  allocator<unsigned_int> local_99;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_98;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  allocator<char> local_41;
  string local_40;
  Var *local_20;
  Var *right_local;
  Var *left_local;
  Expr *this_local;
  
  local_20 = right;
  right_local = left;
  left_local = &this->super_Var;
  iVar1 = (*(left->super_IRNode)._vptr_IRNode[0xd])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  puVar2 = Var::var_width(right_local);
  var_width = *puVar2;
  pvVar3 = Var::size(right_local);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_70,pvVar3);
  pbVar4 = Var::is_signed(right_local);
  Var::Var(&this->super_Var,(Generator *)CONCAT44(extraout_var,iVar1),&local_40,var_width,&local_70,
           (bool)(*pbVar4 & 1),Expression);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_70);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005c6040;
  this->op = Add;
  this->left = right_local;
  this->right = local_20;
  (this->super_Var).type_ = Expression;
  pvVar3 = Var::size(right_local);
  local_90._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar3);
  pvVar3 = Var::size(right_local);
  local_98._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar3);
  std::allocator<unsigned_int>::allocator(&local_99);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,local_90,local_98,
             &local_99);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&(this->super_Var).size_,&local_88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_88);
  std::allocator<unsigned_int>::~allocator(&local_99);
  set_parent(this);
  return;
}

Assistant:

Expr::Expr(Var *left, Var *right)
    : Var(left->generator(), "", left->var_width(), left->size(), left->is_signed(),
          VarType::Expression),
      op(ExprOp::Add),
      left(left),
      right(right) {
    type_ = VarType::Expression;
    size_ = std::vector<uint32_t>(left->size().begin(), left->size().end());
    set_parent();
}